

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::cord_internal::CordzInfo::CordzInfo
          (CordzInfo *this,CordRep *rep,CordzInfo *src,MethodIdentifier method,
          int64_t sampling_stride)

{
  Counter *pCVar1;
  long lVar2;
  int i;
  int iVar3;
  size_t sVar4;
  long lVar5;
  void **__src;
  size_t *psVar6;
  MethodIdentifier MVar7;
  Duration DVar8;
  
  CordzHandle::CordzHandle(&this->super_CordzHandle,false);
  (this->super_CordzHandle)._vptr_CordzHandle = (_func_int **)&PTR__CordzInfo_0058eec0;
  this->list_ = (List *)global_list_;
  (this->ci_prev_)._M_b._M_p = (__pointer_type)0x0;
  (this->ci_next_)._M_b._M_p = (__pointer_type)0x0;
  (this->mutex_).mu_.super___atomic_base<long>._M_i = 0;
  this->rep_ = rep;
  iVar3 = GetStackTrace(this->stack_,0x40,1);
  this->stack_depth_ = (long)iVar3;
  MVar7 = kUnknown;
  if (src == (CordzInfo *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = src->parent_stack_depth_;
    if (sVar4 == 0) {
      __src = src->stack_;
      psVar6 = &src->stack_depth_;
      sVar4 = src->stack_depth_;
    }
    else {
      psVar6 = &src->parent_stack_depth_;
      __src = src->parent_stack_;
    }
    memcpy(this->parent_stack_,__src,sVar4 << 3);
    sVar4 = *psVar6;
  }
  this->parent_stack_depth_ = sVar4;
  this->method_ = method;
  if ((src != (CordzInfo *)0x0) && (MVar7 = src->parent_method_, MVar7 == kUnknown)) {
    MVar7 = src->method_;
  }
  this->parent_method_ = MVar7;
  memset(&this->update_tracker_,0,200);
  DVar8 = (Duration)Now();
  (this->create_time_).rep_ = DVar8;
  this->sampling_stride_ = sampling_stride;
  pCVar1 = (this->update_tracker_).values_ + method;
  (pCVar1->super_atomic<long>).super___atomic_base<long>._M_i =
       (pCVar1->super_atomic<long>).super___atomic_base<long>._M_i + 1;
  if (src != (CordzInfo *)0x0) {
    lVar5 = 0;
    do {
      lVar2 = (src->update_tracker_).values_[lVar5].super_atomic<long>.super___atomic_base<long>.
              _M_i;
      if (lVar2 != 0) {
        pCVar1 = (this->update_tracker_).values_ + lVar5;
        (pCVar1->super_atomic<long>).super___atomic_base<long>._M_i =
             (pCVar1->super_atomic<long>).super___atomic_base<long>._M_i + lVar2;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x19);
  }
  return;
}

Assistant:

CordzInfo::CordzInfo(CordRep* rep, const CordzInfo* src,
                     MethodIdentifier method, int64_t sampling_stride)
    : rep_(rep),
      stack_depth_(
          static_cast<size_t>(absl::GetStackTrace(stack_,
                                                  /*max_depth=*/kMaxStackDepth,
                                                  /*skip_count=*/1))),
      parent_stack_depth_(FillParentStack(src, parent_stack_)),
      method_(method),
      parent_method_(GetParentMethod(src)),
      create_time_(absl::Now()),
      sampling_stride_(sampling_stride) {
  update_tracker_.LossyAdd(method);
  if (src) {
    // Copy parent counters.
    update_tracker_.LossyAdd(src->update_tracker_);
  }
}